

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImRect GetResizeBorderRect(ImGuiWindow *window,int border_n,float perp_padding,float thickness)

{
  undefined8 uVar1;
  int in_ESI;
  undefined1 in_ZMM0 [64];
  undefined1 auVar3 [56];
  undefined1 auVar2 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar5 [56];
  undefined1 auVar4 [64];
  ImRect IVar6;
  ImRect rect;
  float in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  float in_stack_ffffffffffffffc8;
  float x1;
  undefined4 uVar7;
  float fVar8;
  ImRect local_10;
  
  auVar5 = in_ZMM1._8_56_;
  auVar3 = in_ZMM0._8_56_;
  IVar6 = ImGuiWindow::Rect((ImGuiWindow *)0x1d4693);
  auVar4._0_8_ = IVar6.Max;
  auVar4._8_56_ = auVar5;
  auVar2._0_8_ = IVar6.Min;
  auVar2._8_56_ = auVar3;
  uVar1 = vmovlpd_avx(auVar2._0_16_);
  x1 = (float)uVar1;
  uVar7 = (undefined4)((ulong)uVar1 >> 0x20);
  uVar1 = vmovlpd_avx(auVar4._0_16_);
  fVar8 = (float)uVar1;
  if ((in_ZMM1._0_4_ == 0.0) && (!NAN(in_ZMM1._0_4_))) {
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffc4,1.0,1.0);
    operator-=((ImVec2 *)&stack0xffffffffffffffd4,(ImVec2 *)&stack0xffffffffffffffc4);
  }
  if (in_ESI == 0) {
    ImRect::ImRect((ImRect *)CONCAT44(fVar8,uVar7),x1,in_stack_ffffffffffffffc8,
                   in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
  }
  else if (in_ESI == 1) {
    ImRect::ImRect((ImRect *)CONCAT44(fVar8,uVar7),x1,in_stack_ffffffffffffffc8,
                   in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
  }
  else if (in_ESI == 2) {
    ImRect::ImRect((ImRect *)CONCAT44(fVar8,uVar7),x1,in_stack_ffffffffffffffc8,
                   in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
  }
  else {
    if (in_ESI != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0x1490,"ImRect GetResizeBorderRect(ImGuiWindow *, int, float, float)");
    }
    ImRect::ImRect((ImRect *)CONCAT44(fVar8,uVar7),x1,in_stack_ffffffffffffffc8,
                   in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
  }
  return local_10;
}

Assistant:

static ImRect GetResizeBorderRect(ImGuiWindow* window, int border_n, float perp_padding, float thickness)
{
    ImRect rect = window->Rect();
    if (thickness == 0.0f) rect.Max -= ImVec2(1, 1);
    if (border_n == 0) { return ImRect(rect.Min.x + perp_padding, rect.Min.y - thickness,    rect.Max.x - perp_padding, rect.Min.y + thickness);    } // Top
    if (border_n == 1) { return ImRect(rect.Max.x - thickness,    rect.Min.y + perp_padding, rect.Max.x + thickness,    rect.Max.y - perp_padding); } // Right
    if (border_n == 2) { return ImRect(rect.Min.x + perp_padding, rect.Max.y - thickness,    rect.Max.x - perp_padding, rect.Max.y + thickness);    } // Bottom
    if (border_n == 3) { return ImRect(rect.Min.x - thickness,    rect.Min.y + perp_padding, rect.Min.x + thickness,    rect.Max.y - perp_padding); } // Left
    IM_ASSERT(0);
    return ImRect();
}